

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dconnected.cpp
# Opt level: O2

void __thiscall
DReachabilityPropagator::explain_dominator(DReachabilityPropagator *this,int u,int dom,Clause **r)

{
  BoolView *pBVar1;
  bool bVar2;
  Clause *pCVar3;
  vector<bool,_std::allocator<bool>_> red;
  vector<bool,_std::allocator<bool>_> v;
  allocator_type local_8a;
  allocator_type local_89;
  vec<Lit> local_88;
  _Bvector_base<std::allocator<bool>_> local_78;
  _Bvector_base<std::allocator<bool>_> local_50;
  
  local_88.sz = 0;
  local_88.cap = 0;
  local_88.data = (Lit *)0x0;
  vec<Lit>::push(&local_88);
  local_78._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._0_4_ =
       BoolView::getValLit((this->super_GraphPropagator).vs.data + (uint)this->root);
  vec<Lit>::push(&local_88,(Lit *)&local_78);
  pBVar1 = (this->super_GraphPropagator).vs.data;
  if (sat.assigns.data[(uint)pBVar1[(uint)u].v] != '\0') {
    bVar2 = BoolView::isTrue(pBVar1 + (uint)u);
    if (bVar2) {
      local_78._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._0_4_ =
           BoolView::getValLit((this->super_GraphPropagator).vs.data + (uint)u);
      vec<Lit>::push(&local_88,(Lit *)&local_78);
    }
  }
  local_50._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._0_1_ = 0;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&local_78,
             (long)(int)(this->super_GraphPropagator).vs.sz,(bool *)&local_50,&local_8a);
  reverseDFS(this,u,(vector<bool,_std::allocator<bool>_> *)&local_78,dom);
  local_8a = (allocator_type)0x0;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&local_50,
             (long)(int)(this->super_GraphPropagator).vs.sz,(bool *)&local_8a,&local_89);
  reverseDFStoBorder(this,u,(vector<bool,_std::allocator<bool>_> *)&local_50,
                     (vector<bool,_std::allocator<bool>_> *)&local_78,&local_88,dom);
  pCVar3 = Reason_new<vec<Lit>>(&local_88);
  *r = pCVar3;
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_50);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_78);
  free(local_88.data);
  return;
}

Assistant:

void DReachabilityPropagator::explain_dominator(int u, int dom, Clause** r) {
	if (DEBUG) {
		std::cout << "Explain dominators " << getNodeVar(get_root_idx()).isFixed()
							<< getNodeVar(u).isFixed() << '\n';
	}
	vec<Lit> ps;
	ps.push();
	ps.push(getNodeVar(get_root_idx()).getValLit());
	if (getNodeVar(u).isFixed() && getNodeVar(u).isTrue()) {
		ps.push(getNodeVar(u).getValLit());
	}
	std::vector<bool> red(nbNodes(), false);
	reverseDFS(u, red, dom);
	std::vector<bool> v(nbNodes(), false);
	reverseDFStoBorder(u, v, red, ps, dom);
	if (DEBUG) {
		std::cout << "Size expl for dominator " << ps.size() << '\n';
	}
	*r = Reason_new(ps);
}